

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O3

ssize_t tnt_object_add_int(tnt_stream *s,int64_t value)

{
  int *piVar1;
  byte bVar2;
  long *plVar3;
  ssize_t sVar4;
  char *pcVar5;
  char cVar6;
  uint uVar7;
  char local_12;
  undefined1 auStack_11 [7];
  char data [10];
  
  plVar3 = *(long **)((long)s->data + 0x30);
  bVar2 = *(byte *)(plVar3 + 1);
  if (bVar2 != 0) {
    piVar1 = (int *)(*plVar3 + 8 + (ulong)(bVar2 - 1) * 0x10);
    *piVar1 = *piVar1 + 1;
  }
  pcVar5 = auStack_11;
  cVar6 = (char)value;
  local_12 = cVar6;
  if (value < 0) {
    if (0xffffffffffffffdf < (ulong)value) goto LAB_001072ac;
    if ((ulong)value < 0xffffffffffffff80) {
      if ((ulong)value < 0xffffffffffff8000) {
        if ((ulong)value < 0xffffffff80000000) {
          local_12 = -0x2d;
          goto LAB_001072a2;
        }
        local_12 = -0x2e;
        goto LAB_0010728e;
      }
      local_12 = -0x2f;
      goto LAB_00107265;
    }
    local_12 = -0x30;
  }
  else {
    if ((ulong)value < 0x80) goto LAB_001072ac;
    if (0xff < (ulong)value) {
      if (0xffff < (ulong)value) {
        if ((ulong)value >> 0x20 != 0) {
          local_12 = -0x31;
LAB_001072a2:
          _auStack_11 = (ulong)value >> 0x38 | (value & 0xff000000000000U) >> 0x28 |
                        (value & 0xff0000000000U) >> 0x18 | (value & 0xff00000000U) >> 8 |
                        (value & 0xff000000U) << 8 | (value & 0xff0000U) << 0x18 |
                        (value & 0xff00U) << 0x28 | value << 0x38;
          pcVar5 = data + 1;
          goto LAB_001072ac;
        }
        local_12 = -0x32;
LAB_0010728e:
        uVar7 = (uint)value;
        _auStack_11 = CONCAT44(stack0xfffffffffffffff3,
                               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                               uVar7 << 0x18);
        pcVar5 = auStack_11 + 4;
        goto LAB_001072ac;
      }
      local_12 = -0x33;
LAB_00107265:
      _auStack_11 = CONCAT62(stack0xfffffffffffffff1,(ushort)value << 8 | (ushort)value >> 8);
      pcVar5 = auStack_11 + 2;
      goto LAB_001072ac;
    }
    local_12 = -0x34;
  }
  _auStack_11 = CONCAT71(stack0xfffffffffffffff0,cVar6);
  pcVar5 = auStack_11 + 1;
LAB_001072ac:
  sVar4 = (*s->write)(s,&local_12,(long)pcVar5 - (long)&local_12);
  return sVar4;
}

Assistant:

ssize_t
tnt_object_add_int (struct tnt_stream *s, int64_t value)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[10], *end;
	if (value < 0)
		end = mp_encode_int(data, value);
	else
		end = mp_encode_uint(data, value);
	return s->write(s, data, end - data);
}